

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O2

BOOL SwitchToThread(void)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = sched_yield();
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)(iVar1 == 0);
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
SwitchToThread(
    VOID)
{
    BOOL ret;

    PERF_ENTRY(SwitchToThread);
    ENTRY("SwitchToThread(VOID)\n");

    /* sched_yield yields to another thread in the current process. This implementation
       won't work well for cross-process synchronization. */
    ret = (sched_yield() == 0);

    LOGEXIT("SwitchToThread returns BOOL %d\n", ret);
    PERF_EXIT(SwitchToThread);

    return ret;
}